

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastBS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort *puVar1;
  char *pcVar2;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 arena;
  uint uVar3;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *pPVar4;
  ulong uVar5;
  ulong hasbits_00;
  ParseContext *ptr_00;
  ParseContext *ptr_01;
  uint *puVar6;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar2 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar2;
  }
  pPVar4 = (ParseContext *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)pPVar4 & 7) != 0) {
    AlignFail(pPVar4);
  }
  arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
  if ((arena.data & 1) != 0) {
    arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
            ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(arena.data & 0xfffffffffffffffe))->data;
  }
  ptr_00 = (ParseContext *)(ptr + 1);
  if ((Arena *)arena.data == (Arena *)0x0) {
    ptr_01 = ctx;
    puVar1 = (ushort *)
             anon_unknown_143::ReadStringNoArena
                       ((MessageLite *)ptr_00,(char *)ctx,pPVar4,0,table,(ArenaStringPtr *)hasbits);
    pPVar4 = extraout_RDX_00;
  }
  else {
    puVar1 = (ushort *)
             EpsCopyInputStream::ReadArenaString
                       (&ctx->super_EpsCopyInputStream,(char *)ptr_00,(ArenaStringPtr *)pPVar4,
                        (Arena *)arena);
    pPVar4 = extraout_RDX;
    ptr_01 = ptr_00;
  }
  hasbits_00 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  if (puVar1 == (ushort *)0x0) {
    pcVar2 = Error(msg,(char *)ptr_01,pPVar4,(TcFieldData)arena,table,hasbits_00);
    return pcVar2;
  }
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar1) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar6 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar6 & 3) != 0) {
        AlignFail(puVar6);
      }
      *puVar6 = *puVar6 | (uint)hasbits_00;
    }
    return (char *)puVar1;
  }
  uVar3 = (uint)table->fast_idx_mask & (uint)*puVar1;
  if ((uVar3 & 7) == 0) {
    uVar5 = (ulong)(uVar3 & 0xfffffff8);
    pcVar2 = (char *)(**(code **)(&table[1].has_bits_offset + uVar5))
                               (msg,puVar1,ctx,
                                (ulong)*puVar1 ^ *(ulong *)(&table[1].fast_idx_mask + uVar5 * 2),
                                table,hasbits_00);
    return pcVar2;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x44d);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastBS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularString<uint8_t, ArenaStringPtr, kNoUtf8>(
      PROTOBUF_TC_PARAM_PASS);
}